

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * Path::basedir(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  ulong uVar2;
  allocator local_29;
  size_t local_28;
  size_t index;
  string *local_18;
  string *path_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  local_18 = path;
  path_local = __return_storage_ptr__;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = is_root_path(local_18);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_18);
    }
    else {
      local_28 = find_last_slash(local_18);
      if (local_28 == 0xffffffffffffffff) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,".",&local_29);
        std::allocator<char>::~allocator((allocator<char> *)&local_29);
      }
      else {
        if ((local_28 == 0) && (bVar1 = is_abspath(local_18), bVar1)) {
          local_28 = local_28 + 1;
        }
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_18);
        bVar1 = is_root_path(__return_storage_ptr__);
        if (!bVar1) {
          std::__cxx11::string::pop_back();
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"",(allocator *)((long)&index + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

string basedir(const string &path)
{
	if (path.empty())
		return "";

	if (is_root_path(path))
		return path;

	auto index = find_last_slash(path);
	if (index == string::npos)
		return ".";

	// Preserve the first slash.
	if (index == 0 && is_abspath(path))
		index++;

	auto ret = path.substr(0, index + 1);
	if (!is_root_path(ret))
		ret.pop_back();
	return ret;
}